

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int max_connection;
  ostream *poVar2;
  allocator local_2029;
  string local_2028;
  CFtpTransfer t;
  
  if (argc == 4) {
    std::__cxx11::string::string((string *)&local_2028,argv[1],&local_2029);
    iVar1 = atoi(argv[2]);
    max_connection = atoi(argv[3]);
    CFtpTransfer::CFtpTransfer(&t,&local_2028,iVar1,max_connection);
    std::__cxx11::string::~string((string *)&local_2028);
    CTransfer::run(&t.super_CTransfer);
    CFtpTransfer::~CFtpTransfer(&t);
    iVar1 = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Please user SimpleFtpServer [ip] [port] [max_connection] to execute this program."
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main(int argc,char **argv) {
#ifndef _DEBUG
    if(argc != 4){
        cout << "Please user SimpleFtpServer [ip] [port] [max_connection] to execute this program." << endl;
        return -1;
    }
    CFtpTransfer t(argv[1],atoi(argv[2]),atoi(argv[3]));
#else
    CFtpTransfer t("0.0.0.0",5000,2);
#endif
    t.run();
    return 0;
}